

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O2

REF_STATUS ref_smooth_tet_ideal(REF_GRID ref_grid,REF_INT node,REF_INT tet,REF_DBL *ideal_location)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT *pRVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  REF_DBL dn [3];
  REF_DBL m [6];
  REF_INT tri_nodes [27];
  REF_INT nodes [27];
  REF_DBL log_m [6];
  REF_DBL log_m3 [6];
  REF_DBL log_m2 [6];
  REF_DBL log_m1 [6];
  REF_DBL log_m0 [6];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[8];
  uVar3 = ref_cell_nodes(ref_cell,tet,nodes);
  if (uVar3 == 0) {
    tri_nodes[0] = -1;
    tri_nodes[1] = -1;
    tri_nodes[2] = -1;
    lVar4 = 0;
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      if (nodes[lVar5] == node) {
        pRVar1 = ref_cell->f2n;
        for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
          tri_nodes[lVar7] = nodes[*(int *)((long)pRVar1 + lVar7 * 4 + lVar4)];
        }
      }
      lVar4 = lVar4 + 0x10;
    }
    if (tri_nodes[2] == -1 || (tri_nodes[1] == -1 || tri_nodes[0] == -1)) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x538,"ref_smooth_tet_ideal","empty tetrahedra face");
      return 1;
    }
    pRVar2 = ref_node->real;
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      ideal_location[lVar4] =
           (pRVar2[tri_nodes[0] * 0xf + lVar4] + pRVar2[tri_nodes[1] * 0xf + lVar4] +
           pRVar2[tri_nodes[2] * 0xf + lVar4]) / 3.0;
    }
    uVar3 = ref_node_tri_normal(ref_node,tri_nodes,dn);
    if (uVar3 == 0) {
      uVar3 = ref_math_normalize(dn);
      if (uVar3 == 0) {
        uVar3 = ref_node_metric_get_log(ref_node,nodes[0],log_m0);
        if (uVar3 == 0) {
          uVar3 = ref_node_metric_get_log(ref_node,nodes[1],log_m1);
          if (uVar3 == 0) {
            uVar3 = ref_node_metric_get_log(ref_node,nodes[2],log_m2);
            if (uVar3 == 0) {
              uVar3 = ref_node_metric_get_log(ref_node,nodes[3],log_m3);
              if (uVar3 == 0) {
                for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
                  log_m[lVar4] = (log_m0[lVar4] + log_m1[lVar4] + log_m2[lVar4] + log_m3[lVar4]) *
                                 0.25;
                }
                uVar3 = ref_matrix_exp_m(log_m,m);
                if (uVar3 == 0) {
                  dVar10 = (m[5] * dn[2] + m[2] * dn[0] + dn[1] * m[4]) * dn[2] +
                           (m[2] * dn[2] + m[0] * dn[0] + m[1] * dn[1]) * dn[0] +
                           (m[4] * dn[2] + m[1] * dn[0] + m[3] * dn[1]) * dn[1];
                  if (dVar10 < 0.0) {
                    dVar10 = sqrt(dVar10);
                  }
                  else {
                    dVar10 = SQRT(dVar10);
                  }
                  dVar11 = dVar10 * 1e+20;
                  if (dVar11 <= -dVar11) {
                    dVar11 = -dVar11;
                  }
                  if (dVar11 <= 0.8164965809277259) {
                    printf(" length_in_metric = %e, not invertible\n");
                    return 4;
                  }
                  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
                    ideal_location[lVar4] =
                         dn[lVar4] * (0.8164965809277259 / dVar10) + ideal_location[lVar4];
                  }
                  return 0;
                }
                uVar9 = (ulong)uVar3;
                pcVar8 = "exp avg";
                uVar6 = 0x54b;
              }
              else {
                uVar9 = (ulong)uVar3;
                pcVar8 = "get n3 log m";
                uVar6 = 0x548;
              }
            }
            else {
              uVar9 = (ulong)uVar3;
              pcVar8 = "get n2 log m";
              uVar6 = 0x547;
            }
          }
          else {
            uVar9 = (ulong)uVar3;
            pcVar8 = "get n1 log m";
            uVar6 = 0x546;
          }
        }
        else {
          uVar9 = (ulong)uVar3;
          pcVar8 = "get n0 log m";
          uVar6 = 0x545;
        }
      }
      else {
        uVar9 = (ulong)uVar3;
        pcVar8 = "normalize direction";
        uVar6 = 0x542;
      }
    }
    else {
      uVar9 = (ulong)uVar3;
      pcVar8 = "tri normal";
      uVar6 = 0x540;
    }
  }
  else {
    uVar9 = (ulong)uVar3;
    pcVar8 = "get tri";
    uVar6 = 0x52c;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar6,
         "ref_smooth_tet_ideal",uVar9,pcVar8);
  return (REF_STATUS)uVar9;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tet_ideal(REF_GRID ref_grid, REF_INT node,
                                        REF_INT tet, REF_DBL *ideal_location) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT tet_node, tri_node;
  REF_INT ixyz;
  REF_DBL dn[3];
  REF_DBL log_m0[6], log_m1[6], log_m2[6], log_m3[6], log_m[6];
  REF_DBL m[6];
  REF_DBL scale, length_in_metric;
  REF_INT i;

  RSS(ref_cell_nodes(ref_cell, tet, nodes), "get tri");
  tri_nodes[0] = REF_EMPTY;
  tri_nodes[1] = REF_EMPTY;
  tri_nodes[2] = REF_EMPTY;
  for (tet_node = 0; tet_node < 4; tet_node++)
    if (node == nodes[tet_node]) {
      for (tri_node = 0; tri_node < 3; tri_node++)
        tri_nodes[tri_node] =
            nodes[ref_cell_f2n_gen(ref_cell, tri_node, tet_node)];
    }
  if (tri_nodes[0] == REF_EMPTY || tri_nodes[1] == REF_EMPTY ||
      tri_nodes[2] == REF_EMPTY)
    THROW("empty tetrahedra face");

  for (ixyz = 0; ixyz < 3; ixyz++)
    ideal_location[ixyz] = (ref_node_xyz(ref_node, ixyz, tri_nodes[0]) +
                            ref_node_xyz(ref_node, ixyz, tri_nodes[1]) +
                            ref_node_xyz(ref_node, ixyz, tri_nodes[2])) /
                           3.0;

  RSS(ref_node_tri_normal(ref_node, tri_nodes, dn), "tri normal");

  RSS(ref_math_normalize(dn), "normalize direction");

  /* averaged metric */
  RSS(ref_node_metric_get_log(ref_node, nodes[0], log_m0), "get n0 log m");
  RSS(ref_node_metric_get_log(ref_node, nodes[1], log_m1), "get n1 log m");
  RSS(ref_node_metric_get_log(ref_node, nodes[2], log_m2), "get n2 log m");
  RSS(ref_node_metric_get_log(ref_node, nodes[3], log_m3), "get n3 log m");
  for (i = 0; i < 6; i++)
    log_m[i] = (log_m0[i] + log_m1[i] + log_m2[i] + log_m3[i]) * 0.25;
  RSS(ref_matrix_exp_m(log_m, m), "exp avg");

  length_in_metric = ref_matrix_sqrt_vt_m_v(m, dn);

  scale = sqrt(6.0) / 3.0; /* altitude of regular tetrahedra */
  if (ref_math_divisible(scale, length_in_metric)) {
    scale = scale / length_in_metric;
  } else {
    printf(" length_in_metric = %e, not invertible\n", length_in_metric);
    return REF_DIV_ZERO;
  }

  for (ixyz = 0; ixyz < 3; ixyz++) ideal_location[ixyz] += scale * dn[ixyz];

  return REF_SUCCESS;
}